

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall
soplex::SPxSteepPR<double>::load(SPxSteepPR<double> *this,SPxSolverBase<double> *base)

{
  SSVectorBase<double> *this_00;
  long in_RSI;
  long in_RDI;
  int newdim;
  SSVectorBase<double> *in_stack_ffffffffffffffe0;
  
  *(long *)(in_RDI + 0x10) = in_RSI;
  if (in_RSI != 0) {
    SSVectorBase<double>::clear(in_stack_ffffffffffffffe0);
    newdim = (int)((ulong)(in_RDI + 0x38) >> 0x20);
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2dedbe);
    SSVectorBase<double>::reDim(in_stack_ffffffffffffffe0,newdim);
    SSVectorBase<double>::clear(in_stack_ffffffffffffffe0);
    this_00 = (SSVectorBase<double> *)(in_RDI + 0x88);
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2dedf4);
    SSVectorBase<double>::reDim(this_00,newdim);
  }
  return;
}

Assistant:

void SPxSteepPR<R>::load(SPxSolverBase<R>* base)
{
   this->thesolver = base;

   if(base)
   {
      workVec.clear();
      workVec.reDim(base->dim());
      workRhs.clear();
      workRhs.reDim(base->dim());
   }
}